

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void __thiscall
CUI::DoPopupMenu(CUI *this,int X,int Y,int Width,int Height,void *pContext,
                _func_bool_void_ptr_CUIRect *pfnFunc,int Corners)

{
  uint uVar1;
  CUIRect *pCVar2;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/game/client/ui.cpp"
                 ,0x337,(uint)(this->m_NumPopupMenus < 8),"max popup menus exceeded");
  pCVar2 = Screen(this);
  if (pCVar2->w <= (float)(Width + X) && (float)(Width + X) != pCVar2->w) {
    pCVar2 = Screen(this);
    X = (int)(pCVar2->w - (float)Width);
  }
  pCVar2 = Screen(this);
  if (pCVar2->h <= (float)(Height + Y) && (float)(Height + Y) != pCVar2->h) {
    pCVar2 = Screen(this);
    Y = (int)(pCVar2->h - (float)Height);
  }
  uVar1 = this->m_NumPopupMenus;
  this->m_aPopupMenus[uVar1].m_Rect.x = (float)X;
  this->m_aPopupMenus[uVar1].m_Rect.y = (float)Y;
  this->m_aPopupMenus[uVar1].m_Rect.w = (float)Width;
  this->m_aPopupMenus[uVar1].m_Rect.h = (float)Height;
  this->m_aPopupMenus[uVar1].m_Corners = Corners;
  this->m_aPopupMenus[uVar1].m_pContext = pContext;
  this->m_aPopupMenus[uVar1].m_pfnFunc = pfnFunc;
  this->m_aPopupMenus[uVar1].m_New = true;
  this->m_NumPopupMenus = uVar1 + 1;
  return;
}

Assistant:

void CUI::DoPopupMenu(int X, int Y, int Width, int Height, void *pContext, bool (*pfnFunc)(void *pContext, CUIRect View), int Corners)
{
	dbg_assert(m_NumPopupMenus < MAX_POPUP_MENUS, "max popup menus exceeded");

	if(X + Width > Screen()->w)
		X = Screen()->w - Width;
	if(Y + Height > Screen()->h)
		Y = Screen()->h - Height;

	m_aPopupMenus[m_NumPopupMenus].m_Rect.x = X;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.y = Y;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.w = Width;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.h = Height;
	m_aPopupMenus[m_NumPopupMenus].m_Corners = Corners;
	m_aPopupMenus[m_NumPopupMenus].m_pContext = pContext;
	m_aPopupMenus[m_NumPopupMenus].m_pfnFunc = pfnFunc;
	m_aPopupMenus[m_NumPopupMenus].m_New = true;
	m_NumPopupMenus++;
}